

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

void __thiscall
miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>
          (Node<CPubKey> *this,KeyConverter *ctx)

{
  size_t *psVar1;
  Node<CPubKey> *pNVar2;
  pointer psVar3;
  CPubKey *pCVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  Comp CVar7;
  _Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false> *p_Var8;
  pointer __first;
  pointer __last;
  bool bVar9;
  bool bVar10;
  optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_> *__begin0;
  pointer poVar11;
  pointer p_Var12;
  _Rb_tree_node_base *p_Var13;
  _Rb_tree_node_base *p_Var14;
  long lVar15;
  ulong uVar16;
  pointer poVar17;
  pointer poVar18;
  undefined8 uVar19;
  bool *in_RCX;
  _Rb_tree_node_base *__tmp;
  _Tp_alloc_type *__alloc;
  _Base_ptr p_Var20;
  _Rb_tree_node_base *p_Var21;
  allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_> *extraout_RDX;
  optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_> *__first_00;
  _Self __tmp_2;
  ulong uVar22;
  unsigned_long __tmp_1;
  _Rb_tree_impl<Comp,_false> *__src_impl;
  ulong uVar23;
  CPubKey *b;
  _Rb_tree_node_base *p_Var24;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar25;
  ulong local_178;
  vector<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  results;
  vector<StackElem,_std::allocator<StackElem>_> stack;
  _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_> local_120;
  _Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_> local_f0;
  _Optional_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false,_false>
  local_b8;
  _Storage<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false> local_78;
  char local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  results.
  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  results.
  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._0_4_ = 0;
  std::
  vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)#1}>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<std...amespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)#1})const::StackElem>>
  ::
  emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_)const::DummyState>
            ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std___amespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>__1__const__StackElem>>
              *)&stack,this,(int *)&local_78,in_RCX);
  poVar18 = (pointer)0x0;
LAB_003c1d69:
  while( true ) {
    if (stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
        super__Vector_impl_data._M_start) break;
    pNVar2 = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].node;
    uVar16 = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].expanded;
    psVar3 = (pNVar2->subs).
             super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar22 = (long)(pNVar2->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4;
    if (uVar22 <= uVar16) {
      if ((ulong)(((long)poVar18 -
                  (long)results.
                        super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x38) < uVar22) {
        __assert_fail("results.size() >= node.subs.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                      ,0x273,
                      "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = std::optional<std::set<CPubKey, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                     );
      }
      poVar11 = (pointer)((long)results.
                                super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start +
                         uVar22 * -0x38 +
                         ((long)poVar18 -
                         (long)results.
                               super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start));
      poVar17 = poVar11;
      if (((pNVar2->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_engaged == false) ||
         ((pNVar2->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>._M_payload._M_value != true)) {
LAB_003c1e05:
        if (poVar17 != poVar18) goto code_r0x003c1e0a;
        b = (pNVar2->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
            super__Vector_impl_data._M_start;
        pCVar4 = (pNVar2->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        local_178 = ((long)pCVar4 - (long)b) / 0x41;
        local_120._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_120._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_120._M_impl.super__Rb_tree_header._M_header;
        local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_120._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr = (Comp)(Comp)ctx;
        local_120._M_impl.super__Rb_tree_header._M_header._M_right =
             local_120._M_impl.super__Rb_tree_header._M_header._M_left;
        for (; b != pCVar4; b = b + 1) {
          if ((local_120._M_impl.super__Rb_tree_header._M_node_count == 0) ||
             (bVar9 = ::operator<((CPubKey *)
                                  (local_120._M_impl.super__Rb_tree_header._M_header._M_right + 1),b
                                 ), !bVar9)) {
            pVar25 = std::
                     _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                     ::_M_get_insert_unique_pos(&local_120,b);
            p_Var20 = pVar25.second;
            bVar9 = pVar25.first != (_Rb_tree_node_base *)0x0;
          }
          else {
            bVar9 = false;
            p_Var20 = local_120._M_impl.super__Rb_tree_header._M_header._M_right;
          }
          if (p_Var20 != (_Rb_tree_node_base *)0x0) {
            bVar10 = true;
            if (!bVar9 && &local_120._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var20) {
              bVar10 = ::operator<(b,(CPubKey *)(p_Var20 + 1));
            }
            p_Var12 = std::allocator_traits<std::allocator<std::_Rb_tree_node<CPubKey>_>_>::allocate
                                ((allocator_type *)&local_120,1);
            memcpy(&p_Var12->_M_storage,b,0x41);
            std::_Rb_tree_insert_and_rebalance
                      (bVar10,&p_Var12->super__Rb_tree_node_base,p_Var20,
                       &local_120._M_impl.super__Rb_tree_header._M_header);
            local_120._M_impl.super__Rb_tree_header._M_node_count =
                 local_120._M_impl.super__Rb_tree_header._M_node_count + 1;
          }
        }
        if (local_120._M_impl.super__Rb_tree_header._M_node_count == local_178) {
          while (poVar11 != poVar18) {
            uVar16 = *(ulong *)((long)&(poVar11->
                                       super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                       )._M_payload.
                                       super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                       ._M_payload + 0x28);
            if (local_178 < uVar16) {
              p_Var20 = *(_Base_ptr *)
                         ((long)&(poVar11->
                                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                 ._M_payload._M_value._M_t._M_impl + 0x10);
              if (local_120._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
                if (p_Var20 != (_Base_ptr)0x0) {
                  std::_Rb_tree_header::_M_move_data
                            (&local_120._M_impl.super__Rb_tree_header,
                             (_Rb_tree_header *)
                             ((long)&(poVar11->
                                     super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                     )._M_payload.
                                     super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                     ._M_payload._M_value._M_t._M_impl + 8));
                }
              }
              else if (p_Var20 == (_Base_ptr)0x0) {
                *(_Rb_tree_color *)
                 ((long)&(poVar11->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload + 8) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_color;
                *(_Base_ptr *)
                 ((long)&(poVar11->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload._M_value._M_t._M_impl + 0x10) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_parent;
                *(_Base_ptr *)
                 ((long)&(poVar11->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload._M_value._M_t._M_impl + 0x18) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_left;
                *(_Base_ptr *)
                 ((long)&(poVar11->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload + 0x20) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_120._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     (_Base_ptr)
                     ((long)&(poVar11->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload + 8);
                *(ulong *)((long)&(poVar11->
                                  super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                  ._M_payload + 0x28) = local_178;
                local_120._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_120._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_120._M_impl.super__Rb_tree_header._M_header;
                local_120._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_120._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_left;
              }
              else {
                *(_Base_ptr *)
                 ((long)&(poVar11->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload._M_value._M_t._M_impl + 0x10) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var5 = *(_Base_ptr *)
                          ((long)&(poVar11->
                                  super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                  ._M_payload._M_value._M_t._M_impl + 0x18);
                *(_Base_ptr *)
                 ((long)&(poVar11->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload._M_value._M_t._M_impl + 0x18) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var6 = *(_Base_ptr *)
                          ((long)&(poVar11->
                                  super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                  ._M_payload._M_value._M_t._M_impl + 0x20);
                *(_Base_ptr *)
                 ((long)&(poVar11->
                         super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                         )._M_payload.
                         super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                         ._M_payload + 0x20) =
                     local_120._M_impl.super__Rb_tree_header._M_header._M_right;
                p_Var20->_M_parent = &local_120._M_impl.super__Rb_tree_header._M_header;
                (*(_Base_ptr *)
                  ((long)&(poVar11->
                          super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                          )._M_payload.
                          super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                          ._M_payload._M_value._M_t._M_impl + 0x10))->_M_parent =
                     (_Base_ptr)
                     ((long)&(poVar11->
                             super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                             ._M_payload + 8);
                *(ulong *)((long)&(poVar11->
                                  super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                  )._M_payload.
                                  super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                  ._M_payload + 0x28) = local_178;
                local_120._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var20;
                local_120._M_impl.super__Rb_tree_header._M_header._M_left = p_Var5;
                local_120._M_impl.super__Rb_tree_header._M_header._M_right = p_Var6;
                local_120._M_impl.super__Rb_tree_header._M_node_count = uVar16;
              }
              CVar7.ctx_ptr =
                   *(TapSatisfier **)
                    &(poVar11->
                     super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                     ._M_payload._M_value._M_t._M_impl;
              *(Comp *)&(poVar11->
                        super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                        )._M_payload.
                        super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                        ._M_payload._M_value._M_t._M_impl =
                   local_120._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr;
              local_120._M_impl.super__Rb_tree_key_compare<Comp>._M_key_compare.ctx_ptr =
                   (Comp)(Comp)CVar7.ctx_ptr;
            }
            local_178 = local_178 + uVar16;
            p_Var24 = (_Rb_tree_node_base *)
                      ((long)&(poVar11->
                              super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                              ._M_payload._M_value._M_t._M_impl + 8);
            p_Var13 = *(_Rb_tree_node_base **)
                       ((long)&(poVar11->
                               super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                               ._M_payload + 0x18);
            while (p_Var14 = p_Var13, p_Var14 != p_Var24) {
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
              pVar25 = std::
                       _Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>
                       ::_M_get_insert_unique_pos(&local_120,(key_type *)(p_Var14 + 1));
              p_Var21 = pVar25.second;
              if (p_Var21 != (_Rb_tree_node_base *)0x0) {
                p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_rebalance_for_erase(p_Var14,p_Var24);
                psVar1 = (size_t *)
                         ((long)&(poVar11->
                                 super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>
                                 )._M_payload.
                                 super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>
                                 ._M_payload._M_value._M_t._M_impl + 0x28);
                *psVar1 = *psVar1 - 1;
                bVar9 = true;
                if (&local_120._M_impl.super__Rb_tree_header != (_Rb_tree_header *)p_Var21 &&
                    pVar25.first == (_Rb_tree_node_base *)0x0) {
                  bVar9 = ::operator<((CPubKey *)(p_Var14 + 1),(CPubKey *)(p_Var21 + 1));
                }
                std::_Rb_tree_insert_and_rebalance
                          (bVar9,p_Var14,p_Var21,&local_120._M_impl.super__Rb_tree_header._M_header)
                ;
                local_120._M_impl.super__Rb_tree_header._M_node_count =
                     local_120._M_impl.super__Rb_tree_header._M_node_count + 1;
              }
            }
            poVar11 = poVar11 + 1;
            if (local_120._M_impl.super__Rb_tree_header._M_node_count != local_178)
            goto LAB_003c2113;
          }
          (pNVar2->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x100;
          std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>::set
                    ((set<CPubKey,_Comp,_std::allocator<CPubKey>_> *)&local_b8,
                     (set<CPubKey,_Comp,_std::allocator<CPubKey>_> *)&local_120);
          local_b8._M_payload.
          super__Optional_payload<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>
          ._M_payload._M_value.
          super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
          .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
          _M_engaged = true;
        }
        else {
LAB_003c2113:
          (pNVar2->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
          local_b8._M_payload.
          super__Optional_payload<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>
          ._M_payload._M_value.
          super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
          .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>.
          _M_engaged = false;
        }
        std::_Rb_tree<CPubKey,_CPubKey,_std::_Identity<CPubKey>,_Comp,_std::allocator<CPubKey>_>::
        ~_Rb_tree(&local_120);
        goto LAB_003c215d;
      }
      goto LAB_003c1e1e;
    }
    stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
    _M_finish[-1].expanded = uVar16 + 1;
    local_78._0_4_ = 0;
    std::
    vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)#1}>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::{lambda(miniscript::Node<CPubKey>const&,Span<std...amespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)#1})const::StackElem>>
    ::
    emplace_back<miniscript::Node<CPubKey>const&,int,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_)const::DummyState>
              ((vector<miniscript::Node<CPubKey>::TreeEvalMaybe<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::TreeEval<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>)_1_>(miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::_lambda(miniscript::Node<CPubKey>const&,Span<std___amespace)::KeyConverter>(auto:1_const&)const::Comp,std::allocator<CPubKey>>>>__1__const__StackElem>>
                *)&stack,*(Node<CPubKey> **)((bool *)(uVar16 * 0x10) + (long)psVar3),
               (int *)&local_78,(bool *)(uVar16 * 0x10));
  }
  if ((long)poVar18 -
      (long)results.
            super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x38) {
    __assert_fail("results.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h"
                  ,0x27e,
                  "std::optional<Result> miniscript::Node<CPubKey>::TreeEvalMaybe(State, DownFn, UpFn) const [Key = CPubKey, Result = std::optional<std::set<CPubKey, Comp>>, State = DummyState, DownFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:678:13), UpFn = (lambda at /workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/miniscript.h:679:13)]"
                 );
  }
  std::optional<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>::
  optional<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_true>
            ((optional<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_> *)
             &local_b8,
             results.
             super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
LAB_003c22e1:
  std::
  vector<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  ::~vector(&results);
  std::vector<StackElem,_std::allocator<StackElem>_>::~vector(&stack);
  std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>::optional
            ((optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_> *)&local_f0,
             (optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_> *)&local_b8);
  std::
  _Optional_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false,_false>::
  ~_Optional_base(&local_b8);
  std::_Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>::_M_reset
            (&local_f0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003c2428:
  __stack_chk_fail();
code_r0x003c1e0a:
  p_Var8 = &poVar17->
            super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>;
  poVar17 = poVar17 + 1;
  if ((p_Var8->_M_payload).
      super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>
      .super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>._M_engaged
      == false) goto code_r0x003c1e14;
  goto LAB_003c1e05;
code_r0x003c1e14:
  (pNVar2->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
LAB_003c1e1e:
  local_b8._M_payload.
  super__Optional_payload<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_true,_false,_false>
  .super__Optional_payload_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>.
  _M_payload._M_value.
  super__Optional_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_false,_false>._M_payload.
  super__Optional_payload<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>,_true,_false,_false>.
  super__Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>._M_engaged =
       false;
LAB_003c215d:
  std::optional<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>::
  optional<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_true>
            ((optional<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_> *)
             &local_78._M_value,
             (optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_> *)&local_b8);
  std::_Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>::_M_reset
            ((_Optional_payload_base<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_> *)&local_b8
            );
  if (local_40 != '\x01') {
    local_b8._M_payload.
    super__Optional_payload<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>
    ._M_engaged = false;
    std::
    _Optional_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false,_false>
    ::~_Optional_base((_Optional_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false,_false>
                       *)&local_78._M_value);
    goto LAB_003c22e1;
  }
  lVar15 = (long)(pNVar2->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pNVar2->subs).
                 super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (lVar15 * -0x38 != 0) {
    __first_00 = results.
                 super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -lVar15;
    std::
    _Destroy<std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>*,std::optional<std::set<CPubKey,miniscript::Node<CPubKey>::DuplicateKeyCheck<(anonymous_namespace)::KeyConverter>((anonymous_namespace)::KeyConverter_const&)const::Comp,std::allocator<CPubKey>>>>
              (__first_00,
               results.
               super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,extraout_RDX);
    results.
    super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __first_00;
  }
  __last = results.
           super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __first = results.
            super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (results.
      super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      results.
      super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    if ((long)results.
              super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)results.
              super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar19 = std::__throw_length_error("vector::_M_realloc_insert");
        std::
        _Optional_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false,_false>
        ::~_Optional_base((_Optional_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false,_false>
                           *)&local_78._M_value);
        std::
        vector<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
        ::~vector(&results);
        std::vector<StackElem,_std::allocator<StackElem>_>::~vector(&stack);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar19);
        }
      }
      goto LAB_003c2428;
    }
    uVar22 = ((long)results.
                    super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)results.
                   super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38;
    uVar16 = uVar22;
    if (results.
        super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        results.
        super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar16 = 1;
    }
    uVar23 = uVar16 + uVar22;
    __alloc = (_Tp_alloc_type *)0x249249249249249;
    if (0x249249249249248 < uVar23) {
      uVar23 = 0x249249249249249;
    }
    if (CARRY8(uVar16,uVar22)) {
      uVar23 = 0x249249249249249;
    }
    if (uVar23 == 0) {
      poVar17 = (pointer)0x0;
    }
    else {
      poVar17 = (pointer)operator_new(uVar23 * 0x38);
    }
    std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>::optional
              (poVar17 + uVar22,&local_78._M_value);
    poVar18 = std::
              vector<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
              ::_S_relocate(__first,__last,poVar17,__alloc);
    poVar18 = std::
              vector<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
              ::_S_relocate(__last,__last,poVar18 + 1,__alloc);
    std::
    _Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
    ::_M_deallocate((_Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                     *)__first,
                    (pointer)(((long)results.
                                     super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)__first) / 0x38),
                    ((long)results.
                           super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first) %
                    0x38);
    results.
    super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = poVar17 + uVar23;
    results.
    super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = poVar17;
  }
  else {
    std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>::optional
              (results.
               super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_78._M_value);
    poVar18 = __last + 1;
  }
  stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.super__Vector_impl_data.
  _M_finish = stack.super__Vector_base<StackElem,_std::allocator<StackElem>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
  results.
  super__Vector_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_std::allocator<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = poVar18;
  std::
  _Optional_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false,_false>::
  ~_Optional_base((_Optional_base<std::optional<std::set<CPubKey,_Comp,_std::allocator<CPubKey>_>_>,_false,_false>
                   *)&local_78._M_value);
  goto LAB_003c1d69;
}

Assistant:

void DuplicateKeyCheck(const Ctx& ctx) const
    {
        // We cannot use a lambda here, as lambdas are non assignable, and the set operations
        // below require moving the comparators around.
        struct Comp {
            const Ctx* ctx_ptr;
            Comp(const Ctx& ctx) : ctx_ptr(&ctx) {}
            bool operator()(const Key& a, const Key& b) const { return ctx_ptr->KeyCompare(a, b); }
        };

        // state in the recursive computation:
        // - std::nullopt means "this node has duplicates"
        // - an std::set means "this node has no duplicate keys, and they are: ...".
        using keyset = std::set<Key, Comp>;
        using state = std::optional<keyset>;

        auto upfn = [&ctx](const Node& node, Span<state> subs) -> state {
            // If this node is already known to have duplicates, nothing left to do.
            if (node.has_duplicate_keys.has_value() && *node.has_duplicate_keys) return {};

            // Check if one of the children is already known to have duplicates.
            for (auto& sub : subs) {
                if (!sub.has_value()) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            // Start building the set of keys involved in this node and children.
            // Start by keys in this node directly.
            size_t keys_count = node.keys.size();
            keyset key_set{node.keys.begin(), node.keys.end(), Comp(ctx)};
            if (key_set.size() != keys_count) {
                // It already has duplicates; bail out.
                node.has_duplicate_keys = true;
                return {};
            }

            // Merge the keys from the children into this set.
            for (auto& sub : subs) {
                keys_count += sub->size();
                // Small optimization: std::set::merge is linear in the size of the second arg but
                // logarithmic in the size of the first.
                if (key_set.size() < sub->size()) std::swap(key_set, *sub);
                key_set.merge(*sub);
                if (key_set.size() != keys_count) {
                    node.has_duplicate_keys = true;
                    return {};
                }
            }

            node.has_duplicate_keys = false;
            return key_set;
        };

        TreeEval<state>(upfn);
    }